

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O2

int XMLSearch_node_matches(XMLNode *node,XMLSearch *search)

{
  XMLAttribute *pXVar1;
  SXML_CHAR *pSVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  XMLAttribute *pXVar7;
  XMLSearch *local_40;
  
  local_40 = search;
  do {
    if (node == (XMLNode *)0x0) {
      return 0;
    }
    if (local_40 == (XMLSearch *)0x0) {
      return 1;
    }
    if ((node->tag_type & ~TAG_PARTIAL) != TAG_FATHER) {
      return 0;
    }
    if ((local_40->tag != (SXML_CHAR *)0x0) &&
       (iVar3 = (*regstrcmp_search)(node->tag,local_40->tag), iVar3 == 0)) {
      return 0;
    }
    if ((local_40->text != (SXML_CHAR *)0x0) &&
       (iVar3 = (*regstrcmp_search)(node->text,local_40->text), iVar3 == 0)) {
      return 0;
    }
    if (local_40->attributes != (XMLAttribute *)0x0) {
      lVar6 = 0;
      while (lVar6 < local_40->n_attributes) {
        lVar5 = 0x10;
        for (lVar4 = 0; lVar4 < node->n_attributes; lVar4 = lVar4 + 1) {
          pXVar1 = node->attributes;
          if ((*(int *)((long)&pXVar1->name + lVar5) != 0) &&
             (local_40->attributes != (XMLAttribute *)0x0)) {
            pXVar7 = local_40->attributes + lVar6;
            pSVar2 = pXVar7->name;
            if (((pSVar2 == (SXML_CHAR *)0x0) || (*pSVar2 == '\0')) ||
               ((iVar3 = (*regstrcmp_search)(*(SXML_CHAR **)((long)pXVar1 + lVar5 + -0x10),pSVar2),
                iVar3 != 0 &&
                ((pXVar7->value == (SXML_CHAR *)0x0 ||
                 (iVar3 = (*regstrcmp_search)(*(SXML_CHAR **)((long)pXVar1 + lVar5 + -8),
                                              pXVar7->value), iVar3 == pXVar7->active)))))) break;
          }
          lVar5 = lVar5 + 0x18;
        }
        lVar6 = lVar6 + 1;
        if (node->n_attributes <= (int)lVar4) {
          return 0;
        }
      }
    }
    local_40 = local_40->prev;
    if (local_40 == (_XMLSearch *)0x0) {
      return 1;
    }
    node = node->father;
  } while( true );
}

Assistant:

int XMLSearch_node_matches(const XMLNode* node, const XMLSearch* search)
{
	int i, j;

	if (node == NULL)
		return FALSE;

	if (search == NULL)
		return TRUE;

	/* No comments, prolog, or such type of nodes are tested */
	if (node->tag_type != TAG_FATHER && node->tag_type != TAG_SELF)
		return FALSE;

	/* Check tag */
	if (search->tag != NULL && !regstrcmp_search(node->tag, search->tag))
		return FALSE;

	/* Check text */
	if (search->text != NULL && !regstrcmp_search(node->text, search->text))
		return FALSE;

	/* Check attributes */
	if (search->attributes != NULL) {
		for (i = 0; i < search->n_attributes; i++) {
			for (j = 0; j < node->n_attributes; j++) {
				if (!node->attributes[j].active)
					continue;
				if (_attribute_matches(&node->attributes[j], &search->attributes[i]))
					break;
			}
			if (j >= node->n_attributes) /* All attributes where scanned without a successful match */
				return FALSE;
		}
	}

	/* 'node' matches 'search'. If there is a father search, its father must match it */
	if (search->prev != NULL)
		return XMLSearch_node_matches(node->father, search->prev);

	/* TODO: Should a node match if search has no more 'prev' search and node father is still below the initial search ?
	 Depends if XPath started with "//" (=> yes) or "/" (=> no).
	 if (search->prev == NULL && node->father != search->from) return FALSE; ? */
		
	return TRUE;
}